

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::PReLU_x86_avx2::forward_inplace(PReLU_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float *pfVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [16];
  Mat *in_RSI;
  Option *in_RDI;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256 _p_8;
  int remain;
  int nn;
  float slope_2;
  float *ptr_8;
  int q_2;
  float *slope_data_ptr;
  int size;
  int channels;
  int h;
  int w;
  __m128 _p_7;
  int i_7;
  __m128 _slope_7;
  float *ptr_7;
  int q_1;
  int size_2;
  int channels_2;
  int h_4;
  int w_6;
  __m128 _p_6;
  int j_1;
  __m128 _slope_6;
  float *ptr_6;
  int i_6;
  int h_3;
  int w_5;
  __m128 _p_5;
  float *ptr_5;
  int i_5;
  __m128 _slope_5;
  __m128 _slope_4;
  __m128 _p_4;
  float *ptr_4;
  int i_4;
  float *slope_1;
  int w_4;
  __m256 _p_3;
  int i_3;
  __m256 _slope_3;
  float *ptr_3;
  int q;
  int size_1;
  int channels_1;
  int h_2;
  int w_3;
  __m256 _p_2;
  int j;
  __m256 _slope_2;
  float *ptr_2;
  int i_2;
  int h_1;
  int w_2;
  __m256 _p_1;
  float *ptr_1;
  int i_1;
  __m256 _slope_1;
  __m256 _slope;
  __m256 _p;
  float *ptr;
  int i;
  float *slope;
  int w_1;
  int elempack;
  int dims;
  __m256 neg_8;
  __m256 pos_8;
  __m256 neg_3;
  __m256 pos_3;
  __m256 neg_2;
  __m256 pos_2;
  __m256 neg_1;
  __m256 pos_1;
  __m256 neg;
  __m256 pos;
  __m128 neg_7;
  __m128 pos_7;
  __m128 neg_6;
  __m128 pos_6;
  __m128 neg_5;
  __m128 pos_5;
  __m128 neg_4;
  __m128 pos_4;
  float local_1574;
  undefined8 local_1560;
  undefined8 in_stack_ffffffffffffeaa8;
  Mat *in_stack_ffffffffffffeab0;
  Mat *this_00;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  Mat *in_stack_ffffffffffffeb60;
  PReLU *in_stack_ffffffffffffeb68;
  int local_147c;
  int local_1478;
  Mat local_1470;
  undefined1 (*local_1428) [32];
  int local_141c;
  float *local_1418;
  int local_1410;
  int local_140c;
  int local_1408;
  int local_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  int local_13e4;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  Mat local_13c8;
  undefined1 (*local_1380) [16];
  int local_1374;
  int local_1370;
  int local_136c;
  int local_1368;
  int local_1364;
  undefined8 local_1360;
  undefined8 uStack_1358;
  int local_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined1 (*local_1328) [16];
  int local_131c;
  int local_1318;
  int local_1314;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined1 (*local_1300) [16];
  int local_12f4;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined1 (*local_12c0) [16];
  int local_12b4;
  float *local_12b0;
  int local_12a4;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  int local_1264;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  Mat local_1228;
  undefined1 (*local_11e0) [32];
  int local_11d4;
  int local_11d0;
  int local_11cc;
  int local_11c8;
  int local_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  int local_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined1 (*local_1158) [32];
  int local_114c;
  int local_1148;
  int local_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 (*local_1110) [32];
  int local_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 (*local_1088) [32];
  int local_107c;
  float *local_1078;
  int local_106c;
  int local_1068;
  int local_1064;
  Mat *local_1058;
  int local_1044;
  undefined1 (*local_1040) [32];
  undefined1 (*local_1038) [32];
  float *local_1030;
  undefined1 (*local_1028) [32];
  float *local_1020;
  undefined1 (*local_1018) [32];
  float *local_1010;
  undefined1 (*local_1008) [32];
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float fStack_fe4;
  undefined1 (*local_fc8) [32];
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  undefined1 (*local_f88) [32];
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined1 (*local_f48) [32];
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  undefined1 (*local_f08) [32];
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  undefined1 (*local_ec8) [32];
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [32];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c28;
  float local_c24;
  float local_c20;
  float local_c1c;
  undefined1 (*local_c18) [16];
  float *local_c10;
  undefined1 (*local_c08) [16];
  float *local_c00;
  undefined1 (*local_bf8) [16];
  float *local_bf0;
  undefined1 (*local_be8) [16];
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  undefined1 (*local_bc8) [16];
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  undefined1 (*local_ba8) [16];
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  undefined1 (*local_b88) [16];
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  undefined1 (*local_b68) [16];
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float local_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float local_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  ulong uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  ulong uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  ulong uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  ulong uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  ulong uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  ulong uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  ulong uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  ulong uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  ulong uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  ulong uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  float local_3a0;
  float local_39c;
  float local_398;
  float local_394;
  float local_390;
  float local_38c;
  float local_388;
  float local_384;
  undefined1 local_380 [32];
  float local_360;
  float local_35c;
  float local_358;
  float local_354;
  float local_350;
  float local_34c;
  float local_348;
  float local_344;
  undefined1 local_340 [32];
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  float local_310;
  float local_30c;
  float local_308;
  float local_304;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  float local_2b8;
  float local_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  ulong uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  ulong uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  ulong uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  ulong uStack_238;
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  ulong uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  ulong uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  ulong uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  ulong uStack_138;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1064 = in_RSI->dims;
  local_1068 = in_RSI->elempack;
  local_1058 = in_RSI;
  if (local_1068 == 8) {
    if (local_1064 == 1) {
      local_106c = in_RSI->w;
      if (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) < 2) {
        pfVar9 = ncnn::Mat::operator[]
                           ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                   *(long *)(*(long *)in_RDI + -0x18)),0);
        local_c1c = *pfVar9;
        auVar1 = vinsertps_avx(ZEXT416((uint)local_c1c),ZEXT416((uint)local_c1c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_c1c),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_c1c),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_c1c),ZEXT416((uint)local_c1c),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_c1c),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_c1c),0x30);
        auVar12._16_16_ = auVar1;
        auVar12._0_16_ = auVar2;
        local_3c0._0_8_ = auVar2._0_8_;
        local_3c0._8_8_ = auVar2._8_8_;
        local_3c0._16_8_ = auVar1._0_8_;
        local_3c0._24_8_ = auVar1._8_8_;
        local_1100 = local_3c0._0_8_;
        uStack_10f8 = local_3c0._8_8_;
        uStack_10f0 = local_3c0._16_8_;
        uStack_10e8 = local_3c0._24_8_;
        local_3c0 = auVar12;
        local_3a0 = local_c1c;
        local_39c = local_c1c;
        local_398 = local_c1c;
        local_394 = local_c1c;
        local_390 = local_c1c;
        local_38c = local_c1c;
        local_388 = local_c1c;
        local_384 = local_c1c;
        for (local_1104 = 0; local_1104 < local_106c; local_1104 = local_1104 + 1) {
          pfVar9 = ncnn::Mat::operator_cast_to_float_(local_1058);
          local_1110 = (undefined1 (*) [32])(pfVar9 + (local_1104 << 3));
          local_1140 = *(undefined8 *)*local_1110;
          uStack_1138 = *(undefined8 *)(*local_1110 + 8);
          uStack_1130 = *(undefined8 *)(*local_1110 + 0x10);
          uStack_1128 = *(undefined8 *)(*local_1110 + 0x18);
          local_d00 = local_1100;
          uStack_cf8 = uStack_10f8;
          uStack_cf0 = uStack_10f0;
          uStack_ce8 = uStack_10e8;
          local_880 = ZEXT832(0) << 0x20;
          local_9a0 = 0;
          local_860._8_8_ = SUB328(ZEXT832(0),4);
          uStack_998 = local_860._8_8_;
          uStack_990 = 0;
          uStack_988 = 0;
          local_d20 = vmaxps_avx(ZEXT832((ulong)local_860._8_8_) << 0x40,*local_1110);
          local_720 = 0;
          uStack_718 = local_860._8_8_;
          uStack_710 = 0;
          uStack_708 = 0;
          local_d40 = vminps_avx(ZEXT832((ulong)local_860._8_8_) << 0x40,*local_1110);
          local_4a0._0_4_ = (float)local_1100;
          local_4a0._4_4_ = (float)((ulong)local_1100 >> 0x20);
          uStack_498._0_4_ = (float)uStack_10f8;
          uStack_498._4_4_ = (float)((ulong)uStack_10f8 >> 0x20);
          uStack_490._0_4_ = (float)uStack_10f0;
          uStack_490._4_4_ = (float)((ulong)uStack_10f0 >> 0x20);
          uStack_488._0_4_ = (float)uStack_10e8;
          uStack_488._4_4_ = (float)((ulong)uStack_10e8 >> 0x20);
          fStack_5e4 = uStack_488._4_4_;
          local_4c0._0_4_ = local_d40._0_4_;
          local_4c0._4_4_ = local_d40._4_4_;
          uStack_4b8._0_4_ = local_d40._8_4_;
          uStack_4b8._4_4_ = local_d40._12_4_;
          uStack_4b0._0_4_ = local_d40._16_4_;
          uStack_4b0._4_4_ = local_d40._20_4_;
          uStack_4a8._0_4_ = local_d40._24_4_;
          local_600 = (float)local_4a0 * (float)local_4c0;
          fStack_5fc = local_4a0._4_4_ * local_4c0._4_4_;
          fStack_5f8 = (float)uStack_498 * (float)uStack_4b8;
          fStack_5f4 = uStack_498._4_4_ * uStack_4b8._4_4_;
          fStack_5f0 = (float)uStack_490 * (float)uStack_4b0;
          fStack_5ec = uStack_490._4_4_ * uStack_4b0._4_4_;
          fStack_5e8 = (float)uStack_488 * (float)uStack_4a8;
          local_5e0._0_4_ = local_d20._0_4_;
          local_5e0._4_4_ = local_d20._4_4_;
          uStack_5d8._0_4_ = local_d20._8_4_;
          uStack_5d8._4_4_ = local_d20._12_4_;
          uStack_5d0._0_4_ = local_d20._16_4_;
          uStack_5d0._4_4_ = local_d20._20_4_;
          uStack_5c8._0_4_ = local_d20._24_4_;
          uStack_5c8._4_4_ = local_d20._28_4_;
          local_f40 = (float)local_5e0 + local_600;
          fStack_f3c = local_5e0._4_4_ + fStack_5fc;
          fStack_f38 = (float)uStack_5d8 + fStack_5f8;
          fStack_f34 = uStack_5d8._4_4_ + fStack_5f4;
          fStack_f30 = (float)uStack_5d0 + fStack_5f0;
          fStack_f2c = uStack_5d0._4_4_ + fStack_5ec;
          fStack_f28 = (float)uStack_5c8 + fStack_5e8;
          fStack_f24 = uStack_5c8._4_4_ + uStack_488._4_4_;
          *(ulong *)*local_1110 = CONCAT44(fStack_f3c,local_f40);
          *(ulong *)(*local_1110 + 8) = CONCAT44(fStack_f34,fStack_f38);
          *(ulong *)(*local_1110 + 0x10) = CONCAT44(fStack_f2c,fStack_f30);
          *(ulong *)(*local_1110 + 0x18) = CONCAT44(fStack_f24,fStack_f28);
          local_1018 = local_1110;
          local_f08 = local_1110;
          local_ce0 = local_1140;
          uStack_cd8 = uStack_1138;
          uStack_cd0 = uStack_1130;
          uStack_cc8 = uStack_1128;
          local_9c0 = local_1140;
          uStack_9b8 = uStack_1138;
          uStack_9b0 = uStack_1130;
          uStack_9a8 = uStack_1128;
          local_860 = local_880;
          local_740 = local_1140;
          uStack_738 = uStack_1138;
          uStack_730 = uStack_1130;
          uStack_728 = uStack_1128;
          local_5e0 = local_d20._0_8_;
          uStack_5d8 = local_d20._8_8_;
          uStack_5d0 = local_d20._16_8_;
          uStack_5c8 = local_d20._24_8_;
          local_4c0 = local_d40._0_8_;
          uStack_4b8 = local_d40._8_8_;
          uStack_4b0 = local_d40._16_8_;
          uStack_4a8 = local_d40._24_8_;
          local_4a0 = local_1100;
          uStack_498 = uStack_10f8;
          uStack_490 = uStack_10f0;
          uStack_488 = uStack_10e8;
        }
      }
      else {
        local_1078 = ncnn::Mat::operator_cast_to_float_
                               ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                       *(long *)(*(long *)in_RDI + -0x18)));
        for (local_107c = 0; local_107c < local_106c; local_107c = local_107c + 1) {
          pfVar9 = ncnn::Mat::operator_cast_to_float_(local_1058);
          local_1088 = (undefined1 (*) [32])(pfVar9 + (local_107c << 3));
          local_10c0 = *(undefined8 *)*local_1088;
          uStack_10b8 = *(undefined8 *)(*local_1088 + 8);
          uStack_10b0 = *(undefined8 *)(*local_1088 + 0x10);
          uStack_10a8 = *(undefined8 *)(*local_1088 + 0x18);
          local_1010 = local_1078 + (local_107c << 3);
          local_10e0 = *(undefined8 *)local_1010;
          uStack_10d8 = *(undefined8 *)(local_1010 + 2);
          uStack_10d0 = *(undefined8 *)(local_1010 + 4);
          uStack_10c8 = *(undefined8 *)(local_1010 + 6);
          local_8c0 = ZEXT832(0) << 0x20;
          local_9e0 = 0;
          local_8a0._8_8_ = SUB328(ZEXT832(0),4);
          uStack_9d8 = local_8a0._8_8_;
          uStack_9d0 = 0;
          uStack_9c8 = 0;
          local_ca0 = vmaxps_avx(ZEXT832((ulong)local_8a0._8_8_) << 0x40,*local_1088);
          local_760 = 0;
          uStack_758 = local_8a0._8_8_;
          uStack_750 = 0;
          uStack_748 = 0;
          local_cc0 = vminps_avx(ZEXT832((ulong)local_8a0._8_8_) << 0x40,*local_1088);
          local_4e0._0_4_ = (float)local_10e0;
          local_4e0._4_4_ = (float)((ulong)local_10e0 >> 0x20);
          uStack_4d8._0_4_ = (float)uStack_10d8;
          uStack_4d8._4_4_ = (float)((ulong)uStack_10d8 >> 0x20);
          uStack_4d0._0_4_ = (float)uStack_10d0;
          uStack_4d0._4_4_ = (float)((ulong)uStack_10d0 >> 0x20);
          uStack_4c8._0_4_ = (float)uStack_10c8;
          uStack_4c8._4_4_ = (float)((ulong)uStack_10c8 >> 0x20);
          fStack_624 = uStack_4c8._4_4_;
          local_500._0_4_ = local_cc0._0_4_;
          local_500._4_4_ = local_cc0._4_4_;
          uStack_4f8._0_4_ = local_cc0._8_4_;
          uStack_4f8._4_4_ = local_cc0._12_4_;
          uStack_4f0._0_4_ = local_cc0._16_4_;
          uStack_4f0._4_4_ = local_cc0._20_4_;
          uStack_4e8._0_4_ = local_cc0._24_4_;
          local_640 = (float)local_4e0 * (float)local_500;
          fStack_63c = local_4e0._4_4_ * local_500._4_4_;
          fStack_638 = (float)uStack_4d8 * (float)uStack_4f8;
          fStack_634 = uStack_4d8._4_4_ * uStack_4f8._4_4_;
          fStack_630 = (float)uStack_4d0 * (float)uStack_4f0;
          fStack_62c = uStack_4d0._4_4_ * uStack_4f0._4_4_;
          fStack_628 = (float)uStack_4c8 * (float)uStack_4e8;
          local_620._0_4_ = local_ca0._0_4_;
          local_620._4_4_ = local_ca0._4_4_;
          uStack_618._0_4_ = local_ca0._8_4_;
          uStack_618._4_4_ = local_ca0._12_4_;
          uStack_610._0_4_ = local_ca0._16_4_;
          uStack_610._4_4_ = local_ca0._20_4_;
          uStack_608._0_4_ = local_ca0._24_4_;
          uStack_608._4_4_ = local_ca0._28_4_;
          local_f00 = (float)local_620 + local_640;
          fStack_efc = local_620._4_4_ + fStack_63c;
          fStack_ef8 = (float)uStack_618 + fStack_638;
          fStack_ef4 = uStack_618._4_4_ + fStack_634;
          fStack_ef0 = (float)uStack_610 + fStack_630;
          fStack_eec = uStack_610._4_4_ + fStack_62c;
          fStack_ee8 = (float)uStack_608 + fStack_628;
          fStack_ee4 = uStack_608._4_4_ + uStack_4c8._4_4_;
          *(ulong *)*local_1088 = CONCAT44(fStack_efc,local_f00);
          *(ulong *)(*local_1088 + 8) = CONCAT44(fStack_ef4,fStack_ef8);
          *(ulong *)(*local_1088 + 0x10) = CONCAT44(fStack_eec,fStack_ef0);
          *(ulong *)(*local_1088 + 0x18) = CONCAT44(fStack_ee4,fStack_ee8);
          local_1008 = local_1088;
          local_ec8 = local_1088;
          local_c80 = local_10e0;
          uStack_c78 = uStack_10d8;
          uStack_c70 = uStack_10d0;
          uStack_c68 = uStack_10c8;
          local_c60 = local_10c0;
          uStack_c58 = uStack_10b8;
          uStack_c50 = uStack_10b0;
          uStack_c48 = uStack_10a8;
          local_a00 = local_10c0;
          uStack_9f8 = uStack_10b8;
          uStack_9f0 = uStack_10b0;
          uStack_9e8 = uStack_10a8;
          local_8a0 = local_8c0;
          local_780 = local_10c0;
          uStack_778 = uStack_10b8;
          uStack_770 = uStack_10b0;
          uStack_768 = uStack_10a8;
          local_620 = local_ca0._0_8_;
          uStack_618 = local_ca0._8_8_;
          uStack_610 = local_ca0._16_8_;
          uStack_608 = local_ca0._24_8_;
          local_500 = local_cc0._0_8_;
          uStack_4f8 = local_cc0._8_8_;
          uStack_4f0 = local_cc0._16_8_;
          uStack_4e8 = local_cc0._24_8_;
          local_4e0 = local_10e0;
          uStack_4d8 = uStack_10d8;
          uStack_4d0 = uStack_10d0;
          uStack_4c8 = uStack_10c8;
        }
      }
    }
    if (local_1064 == 2) {
      local_1144 = local_1058->w;
      local_1148 = local_1058->h;
      for (local_114c = 0; local_114c < local_1148; local_114c = local_114c + 1) {
        local_1158 = (undefined1 (*) [32])ncnn::Mat::row(local_1058,local_114c);
        if (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) < 2)
        {
          pfVar9 = ncnn::Mat::operator[]
                             ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                     *(long *)(*(long *)in_RDI + -0x18)),0);
          local_c20 = *pfVar9;
          auVar1 = vinsertps_avx(ZEXT416((uint)local_c20),ZEXT416((uint)local_c20),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_c20),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_c20),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_c20),ZEXT416((uint)local_c20),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_c20),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_c20),0x30);
          auVar13._16_16_ = auVar1;
          auVar13._0_16_ = auVar2;
          local_380._0_8_ = auVar2._0_8_;
          local_380._8_8_ = auVar2._8_8_;
          local_380._16_8_ = auVar1._0_8_;
          local_380._24_8_ = auVar1._8_8_;
          local_14e0 = local_380._0_8_;
          uStack_14d8 = local_380._8_8_;
          uStack_14d0 = local_380._16_8_;
          uStack_14c8 = local_380._24_8_;
          local_380 = auVar13;
          local_360 = local_c20;
          local_35c = local_c20;
          local_358 = local_c20;
          local_354 = local_c20;
          local_350 = local_c20;
          local_34c = local_c20;
          local_348 = local_c20;
          local_344 = local_c20;
        }
        else {
          local_1020 = ncnn::Mat::operator_cast_to_float_
                                 ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                         *(long *)(*(long *)in_RDI + -0x18)));
          local_1020 = local_1020 + (local_114c << 3);
          local_14e0 = *(undefined8 *)local_1020;
          uStack_14d8 = *(undefined8 *)(local_1020 + 2);
          uStack_14d0 = *(undefined8 *)(local_1020 + 4);
          uStack_14c8 = *(undefined8 *)(local_1020 + 6);
        }
        local_1180 = local_14e0;
        uStack_1178 = uStack_14d8;
        uStack_1170 = uStack_14d0;
        uStack_1168 = uStack_14c8;
        for (local_1184 = 0; local_1184 < local_1144; local_1184 = local_1184 + 1) {
          local_1028 = local_1158;
          local_11c0 = *(undefined8 *)*local_1158;
          uStack_11b8 = *(undefined8 *)(*local_1158 + 8);
          uStack_11b0 = *(undefined8 *)(*local_1158 + 0x10);
          uStack_11a8 = *(undefined8 *)(*local_1158 + 0x18);
          local_f48 = local_1158;
          local_d80 = local_14e0;
          uStack_d78 = uStack_14d8;
          uStack_d70 = uStack_14d0;
          uStack_d68 = uStack_14c8;
          local_840 = ZEXT832(0) << 0x20;
          local_960 = 0;
          local_820._8_8_ = SUB328(ZEXT832(0),4);
          uStack_958 = local_820._8_8_;
          uStack_950 = 0;
          uStack_948 = 0;
          local_da0 = vmaxps_avx(ZEXT832((ulong)local_820._8_8_) << 0x40,*local_1158);
          local_6e0 = 0;
          uStack_6d8 = local_820._8_8_;
          uStack_6d0 = 0;
          uStack_6c8 = 0;
          local_dc0 = vminps_avx(ZEXT832((ulong)local_820._8_8_) << 0x40,*local_1158);
          local_460._0_4_ = (float)local_14e0;
          local_460._4_4_ = (float)((ulong)local_14e0 >> 0x20);
          uStack_458._0_4_ = (float)uStack_14d8;
          uStack_458._4_4_ = (float)((ulong)uStack_14d8 >> 0x20);
          uStack_450._0_4_ = (float)uStack_14d0;
          uStack_450._4_4_ = (float)((ulong)uStack_14d0 >> 0x20);
          uStack_448._0_4_ = (float)uStack_14c8;
          uStack_448._4_4_ = (float)((ulong)uStack_14c8 >> 0x20);
          fStack_5a4 = uStack_448._4_4_;
          local_480._0_4_ = local_dc0._0_4_;
          local_480._4_4_ = local_dc0._4_4_;
          uStack_478._0_4_ = local_dc0._8_4_;
          uStack_478._4_4_ = local_dc0._12_4_;
          uStack_470._0_4_ = local_dc0._16_4_;
          uStack_470._4_4_ = local_dc0._20_4_;
          uStack_468._0_4_ = local_dc0._24_4_;
          local_5c0 = (float)local_460 * (float)local_480;
          fStack_5bc = local_460._4_4_ * local_480._4_4_;
          fStack_5b8 = (float)uStack_458 * (float)uStack_478;
          fStack_5b4 = uStack_458._4_4_ * uStack_478._4_4_;
          fStack_5b0 = (float)uStack_450 * (float)uStack_470;
          fStack_5ac = uStack_450._4_4_ * uStack_470._4_4_;
          fStack_5a8 = (float)uStack_448 * (float)uStack_468;
          local_5a0._0_4_ = local_da0._0_4_;
          local_5a0._4_4_ = local_da0._4_4_;
          uStack_598._0_4_ = local_da0._8_4_;
          uStack_598._4_4_ = local_da0._12_4_;
          uStack_590._0_4_ = local_da0._16_4_;
          uStack_590._4_4_ = local_da0._20_4_;
          uStack_588._0_4_ = local_da0._24_4_;
          uStack_588._4_4_ = local_da0._28_4_;
          local_f80 = (float)local_5a0 + local_5c0;
          fStack_f7c = local_5a0._4_4_ + fStack_5bc;
          fStack_f78 = (float)uStack_598 + fStack_5b8;
          fStack_f74 = uStack_598._4_4_ + fStack_5b4;
          fStack_f70 = (float)uStack_590 + fStack_5b0;
          fStack_f6c = uStack_590._4_4_ + fStack_5ac;
          fStack_f68 = (float)uStack_588 + fStack_5a8;
          fStack_f64 = uStack_588._4_4_ + uStack_448._4_4_;
          *(ulong *)*local_1158 = CONCAT44(fStack_f7c,local_f80);
          *(ulong *)(*local_1158 + 8) = CONCAT44(fStack_f74,fStack_f78);
          *(ulong *)(*local_1158 + 0x10) = CONCAT44(fStack_f6c,fStack_f70);
          *(ulong *)(*local_1158 + 0x18) = CONCAT44(fStack_f64,fStack_f68);
          local_1158 = local_1158 + 1;
          local_d60 = local_11c0;
          uStack_d58 = uStack_11b8;
          uStack_d50 = uStack_11b0;
          uStack_d48 = uStack_11a8;
          local_980 = local_11c0;
          uStack_978 = uStack_11b8;
          uStack_970 = uStack_11b0;
          uStack_968 = uStack_11a8;
          local_820 = local_840;
          local_700 = local_11c0;
          uStack_6f8 = uStack_11b8;
          uStack_6f0 = uStack_11b0;
          uStack_6e8 = uStack_11a8;
          local_5a0 = local_da0._0_8_;
          uStack_598 = local_da0._8_8_;
          uStack_590 = local_da0._16_8_;
          uStack_588 = local_da0._24_8_;
          local_480 = local_dc0._0_8_;
          uStack_478 = local_dc0._8_8_;
          uStack_470 = local_dc0._16_8_;
          uStack_468 = local_dc0._24_8_;
          local_460 = local_14e0;
          uStack_458 = uStack_14d8;
          uStack_450 = uStack_14d0;
          uStack_448 = uStack_14c8;
        }
      }
    }
    if (local_1064 == 3) {
      local_11c4 = local_1058->w;
      local_11c8 = local_1058->h;
      local_11cc = local_1058->c;
      local_11d0 = local_11c4 * local_11c8;
      for (local_11d4 = 0; local_11d4 < local_11cc; local_11d4 = local_11d4 + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffeab0,(int)((ulong)in_stack_ffffffffffffeaa8 >> 0x20)
                          );
        pauVar10 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1228);
        ncnn::Mat::~Mat((Mat *)0x4d267c);
        local_11e0 = pauVar10;
        if (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) < 2)
        {
          pfVar9 = ncnn::Mat::operator[]
                             ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                     *(long *)(*(long *)in_RDI + -0x18)),0);
          local_c24 = *pfVar9;
          auVar1 = vinsertps_avx(ZEXT416((uint)local_c24),ZEXT416((uint)local_c24),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_c24),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_c24),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_c24),ZEXT416((uint)local_c24),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_c24),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_c24),0x30);
          auVar14._16_16_ = auVar1;
          auVar14._0_16_ = auVar2;
          local_340._0_8_ = auVar2._0_8_;
          local_340._8_8_ = auVar2._8_8_;
          local_340._16_8_ = auVar1._0_8_;
          local_340._24_8_ = auVar1._8_8_;
          local_1520 = local_340._0_8_;
          uStack_1518 = local_340._8_8_;
          uStack_1510 = local_340._16_8_;
          uStack_1508 = local_340._24_8_;
          local_340 = auVar14;
          local_320 = local_c24;
          local_31c = local_c24;
          local_318 = local_c24;
          local_314 = local_c24;
          local_310 = local_c24;
          local_30c = local_c24;
          local_308 = local_c24;
          local_304 = local_c24;
        }
        else {
          local_1030 = ncnn::Mat::operator_cast_to_float_
                                 ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                         *(long *)(*(long *)in_RDI + -0x18)));
          local_1030 = local_1030 + (local_11d4 << 3);
          local_1520 = *(undefined8 *)local_1030;
          uStack_1518 = *(undefined8 *)(local_1030 + 2);
          uStack_1510 = *(undefined8 *)(local_1030 + 4);
          uStack_1508 = *(undefined8 *)(local_1030 + 6);
        }
        local_1260 = local_1520;
        uStack_1258 = uStack_1518;
        uStack_1250 = uStack_1510;
        uStack_1248 = uStack_1508;
        for (local_1264 = 0; local_1264 < local_11d0; local_1264 = local_1264 + 1) {
          local_1038 = local_11e0;
          local_12a0 = *(undefined8 *)*local_11e0;
          uStack_1298 = *(undefined8 *)(*local_11e0 + 8);
          uStack_1290 = *(undefined8 *)(*local_11e0 + 0x10);
          uStack_1288 = *(undefined8 *)(*local_11e0 + 0x18);
          local_f88 = local_11e0;
          local_e00 = local_1520;
          uStack_df8 = uStack_1518;
          uStack_df0 = uStack_1510;
          uStack_de8 = uStack_1508;
          local_800 = ZEXT832(0) << 0x20;
          local_920 = 0;
          local_7e0._8_8_ = SUB328(ZEXT832(0),4);
          uStack_918 = local_7e0._8_8_;
          uStack_910 = 0;
          uStack_908 = 0;
          local_e20 = vmaxps_avx(ZEXT832((ulong)local_7e0._8_8_) << 0x40,*local_11e0);
          local_6a0 = 0;
          uStack_698 = local_7e0._8_8_;
          uStack_690 = 0;
          uStack_688 = 0;
          local_e40 = vminps_avx(ZEXT832((ulong)local_7e0._8_8_) << 0x40,*local_11e0);
          local_420._0_4_ = (float)local_1520;
          local_420._4_4_ = (float)((ulong)local_1520 >> 0x20);
          uStack_418._0_4_ = (float)uStack_1518;
          uStack_418._4_4_ = (float)((ulong)uStack_1518 >> 0x20);
          uStack_410._0_4_ = (float)uStack_1510;
          uStack_410._4_4_ = (float)((ulong)uStack_1510 >> 0x20);
          uStack_408._0_4_ = (float)uStack_1508;
          uStack_408._4_4_ = (float)((ulong)uStack_1508 >> 0x20);
          fStack_564 = uStack_408._4_4_;
          local_440._0_4_ = local_e40._0_4_;
          local_440._4_4_ = local_e40._4_4_;
          uStack_438._0_4_ = local_e40._8_4_;
          uStack_438._4_4_ = local_e40._12_4_;
          uStack_430._0_4_ = local_e40._16_4_;
          uStack_430._4_4_ = local_e40._20_4_;
          uStack_428._0_4_ = local_e40._24_4_;
          local_580 = (float)local_420 * (float)local_440;
          fStack_57c = local_420._4_4_ * local_440._4_4_;
          fStack_578 = (float)uStack_418 * (float)uStack_438;
          fStack_574 = uStack_418._4_4_ * uStack_438._4_4_;
          fStack_570 = (float)uStack_410 * (float)uStack_430;
          fStack_56c = uStack_410._4_4_ * uStack_430._4_4_;
          fStack_568 = (float)uStack_408 * (float)uStack_428;
          local_560._0_4_ = local_e20._0_4_;
          local_560._4_4_ = local_e20._4_4_;
          uStack_558._0_4_ = local_e20._8_4_;
          uStack_558._4_4_ = local_e20._12_4_;
          uStack_550._0_4_ = local_e20._16_4_;
          uStack_550._4_4_ = local_e20._20_4_;
          uStack_548._0_4_ = local_e20._24_4_;
          uStack_548._4_4_ = local_e20._28_4_;
          local_fc0 = (float)local_560 + local_580;
          fStack_fbc = local_560._4_4_ + fStack_57c;
          fStack_fb8 = (float)uStack_558 + fStack_578;
          fStack_fb4 = uStack_558._4_4_ + fStack_574;
          fStack_fb0 = (float)uStack_550 + fStack_570;
          fStack_fac = uStack_550._4_4_ + fStack_56c;
          fStack_fa8 = (float)uStack_548 + fStack_568;
          fStack_fa4 = uStack_548._4_4_ + uStack_408._4_4_;
          *(ulong *)*local_11e0 = CONCAT44(fStack_fbc,local_fc0);
          *(ulong *)(*local_11e0 + 8) = CONCAT44(fStack_fb4,fStack_fb8);
          *(ulong *)(*local_11e0 + 0x10) = CONCAT44(fStack_fac,fStack_fb0);
          *(ulong *)(*local_11e0 + 0x18) = CONCAT44(fStack_fa4,fStack_fa8);
          local_11e0 = local_11e0 + 1;
          local_de0 = local_12a0;
          uStack_dd8 = uStack_1298;
          uStack_dd0 = uStack_1290;
          uStack_dc8 = uStack_1288;
          local_940 = local_12a0;
          uStack_938 = uStack_1298;
          uStack_930 = uStack_1290;
          uStack_928 = uStack_1288;
          local_7e0 = local_800;
          local_6c0 = local_12a0;
          uStack_6b8 = uStack_1298;
          uStack_6b0 = uStack_1290;
          uStack_6a8 = uStack_1288;
          local_560 = local_e20._0_8_;
          uStack_558 = local_e20._8_8_;
          uStack_550 = local_e20._16_8_;
          uStack_548 = local_e20._24_8_;
          local_440 = local_e40._0_8_;
          uStack_438 = local_e40._8_8_;
          uStack_430 = local_e40._16_8_;
          uStack_428 = local_e40._24_8_;
          local_420 = local_1520;
          uStack_418 = uStack_1518;
          uStack_410 = uStack_1510;
          uStack_408 = uStack_1508;
        }
      }
    }
    local_1044 = 0;
  }
  else if (local_1068 == 4) {
    if (local_1064 == 1) {
      local_12a4 = in_RSI->w;
      if (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) < 2) {
        pfVar9 = ncnn::Mat::operator[]
                           ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                   *(long *)(*(long *)in_RDI + -0x18)),0);
        local_a20 = *pfVar9;
        local_12f0 = CONCAT44(local_a20,local_a20);
        uStack_12e8 = CONCAT44(local_a20,local_a20);
        fStack_a1c = local_a20;
        fStack_a18 = local_a20;
        fStack_a14 = local_a20;
        local_a04 = local_a20;
        for (local_12f4 = 0; local_12f4 < local_12a4; local_12f4 = local_12f4 + 1) {
          pfVar9 = ncnn::Mat::operator_cast_to_float_(local_1058);
          local_1300 = (undefined1 (*) [16])(pfVar9 + (local_12f4 << 2));
          local_1310 = *(undefined8 *)*local_1300;
          uStack_1308 = *(undefined8 *)(*local_1300 + 8);
          local_ac0 = local_12f0;
          uStack_ab8 = uStack_12e8;
          local_210 = ZEXT816(0) << 0x20;
          local_280 = 0;
          local_200._8_8_ = SUB168(ZEXT816(0),4);
          uStack_278 = local_200._8_8_;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_200._8_8_;
          local_ad0 = vmaxps_avx(auVar1 << 0x40,*local_1300);
          local_180 = 0;
          uStack_178 = local_200._8_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_200._8_8_;
          local_ae0 = vminps_avx(auVar2 << 0x40,*local_1300);
          local_80._0_4_ = (float)local_12f0;
          local_80._4_4_ = (float)((ulong)local_12f0 >> 0x20);
          uStack_78._0_4_ = (float)uStack_12e8;
          uStack_78._4_4_ = (float)((ulong)uStack_12e8 >> 0x20);
          local_90._0_4_ = local_ae0._0_4_;
          local_90._4_4_ = local_ae0._4_4_;
          uStack_88._0_4_ = local_ae0._8_4_;
          uStack_88._4_4_ = local_ae0._12_4_;
          local_110 = (float)local_80 * (float)local_90;
          fStack_10c = local_80._4_4_ * local_90._4_4_;
          fStack_108 = (float)uStack_78 * (float)uStack_88;
          fStack_104 = uStack_78._4_4_ * uStack_88._4_4_;
          local_100._0_4_ = local_ad0._0_4_;
          local_100._4_4_ = local_ad0._4_4_;
          uStack_f8._0_4_ = local_ad0._8_4_;
          uStack_f8._4_4_ = local_ad0._12_4_;
          local_ba0 = (float)local_100 + local_110;
          fStack_b9c = local_100._4_4_ + fStack_10c;
          fStack_b98 = (float)uStack_f8 + fStack_108;
          fStack_b94 = uStack_f8._4_4_ + fStack_104;
          *(ulong *)*local_1300 = CONCAT44(fStack_b9c,local_ba0);
          *(ulong *)(*local_1300 + 8) = CONCAT44(fStack_b94,fStack_b98);
          local_bf8 = local_1300;
          local_b88 = local_1300;
          local_ab0 = local_1310;
          uStack_aa8 = uStack_1308;
          local_290 = local_1310;
          uStack_288 = uStack_1308;
          local_200 = local_210;
          local_190 = local_1310;
          uStack_188 = uStack_1308;
          local_100 = local_ad0._0_8_;
          uStack_f8 = local_ad0._8_8_;
          local_90 = local_ae0._0_8_;
          uStack_88 = local_ae0._8_8_;
          local_80 = local_12f0;
          uStack_78 = uStack_12e8;
        }
      }
      else {
        local_12b0 = ncnn::Mat::operator_cast_to_float_
                               ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                       *(long *)(*(long *)in_RDI + -0x18)));
        for (local_12b4 = 0; local_12b4 < local_12a4; local_12b4 = local_12b4 + 1) {
          pfVar9 = ncnn::Mat::operator_cast_to_float_(local_1058);
          local_12c0 = (undefined1 (*) [16])(pfVar9 + (local_12b4 << 2));
          local_12d0 = *(undefined8 *)*local_12c0;
          uStack_12c8 = *(undefined8 *)(*local_12c0 + 8);
          local_bf0 = local_12b0 + (local_12b4 << 2);
          local_12e0 = *(undefined8 *)local_bf0;
          uStack_12d8 = *(undefined8 *)(local_bf0 + 2);
          local_230 = ZEXT816(0) << 0x20;
          local_2a0 = 0;
          local_220._8_8_ = SUB168(ZEXT816(0),4);
          uStack_298 = local_220._8_8_;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_220._8_8_;
          local_a90 = vmaxps_avx(auVar3 << 0x40,*local_12c0);
          local_1a0 = 0;
          uStack_198 = local_220._8_8_;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_220._8_8_;
          local_aa0 = vminps_avx(auVar4 << 0x40,*local_12c0);
          local_a0._0_4_ = (float)local_12e0;
          local_a0._4_4_ = (float)((ulong)local_12e0 >> 0x20);
          uStack_98._0_4_ = (float)uStack_12d8;
          uStack_98._4_4_ = (float)((ulong)uStack_12d8 >> 0x20);
          local_b0._0_4_ = local_aa0._0_4_;
          local_b0._4_4_ = local_aa0._4_4_;
          uStack_a8._0_4_ = local_aa0._8_4_;
          uStack_a8._4_4_ = local_aa0._12_4_;
          local_130 = (float)local_a0 * (float)local_b0;
          fStack_12c = local_a0._4_4_ * local_b0._4_4_;
          fStack_128 = (float)uStack_98 * (float)uStack_a8;
          fStack_124 = uStack_98._4_4_ * uStack_a8._4_4_;
          local_120._0_4_ = local_a90._0_4_;
          local_120._4_4_ = local_a90._4_4_;
          uStack_118._0_4_ = local_a90._8_4_;
          uStack_118._4_4_ = local_a90._12_4_;
          local_b80 = (float)local_120 + local_130;
          fStack_b7c = local_120._4_4_ + fStack_12c;
          fStack_b78 = (float)uStack_118 + fStack_128;
          fStack_b74 = uStack_118._4_4_ + fStack_124;
          *(ulong *)*local_12c0 = CONCAT44(fStack_b7c,local_b80);
          *(ulong *)(*local_12c0 + 8) = CONCAT44(fStack_b74,fStack_b78);
          local_be8 = local_12c0;
          local_b68 = local_12c0;
          local_a80 = local_12e0;
          uStack_a78 = uStack_12d8;
          local_a70 = local_12d0;
          uStack_a68 = uStack_12c8;
          local_2b0 = local_12d0;
          uStack_2a8 = uStack_12c8;
          local_220 = local_230;
          local_1b0 = local_12d0;
          uStack_1a8 = uStack_12c8;
          local_120 = local_a90._0_8_;
          uStack_118 = local_a90._8_8_;
          local_b0 = local_aa0._0_8_;
          uStack_a8 = local_aa0._8_8_;
          local_a0 = local_12e0;
          uStack_98 = uStack_12d8;
        }
      }
    }
    if (local_1064 == 2) {
      local_1314 = local_1058->w;
      local_1318 = local_1058->h;
      for (local_131c = 0; local_131c < local_1318; local_131c = local_131c + 1) {
        local_1328 = (undefined1 (*) [16])ncnn::Mat::row(local_1058,local_131c);
        if (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) < 2)
        {
          pfVar9 = ncnn::Mat::operator[]
                             ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                     *(long *)(*(long *)in_RDI + -0x18)),0);
          local_a40 = *pfVar9;
          local_1540 = CONCAT44(local_a40,local_a40);
          uStack_1538 = CONCAT44(local_a40,local_a40);
          fStack_a3c = local_a40;
          fStack_a38 = local_a40;
          fStack_a34 = local_a40;
          local_a24 = local_a40;
        }
        else {
          local_c00 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                        *(long *)(*(long *)in_RDI + -0x18)));
          local_c00 = local_c00 + (local_131c << 2);
          local_1540 = *(undefined8 *)local_c00;
          uStack_1538 = *(undefined8 *)(local_c00 + 2);
        }
        local_1340 = local_1540;
        uStack_1338 = uStack_1538;
        for (local_1344 = 0; local_1344 < local_1314; local_1344 = local_1344 + 1) {
          local_c08 = local_1328;
          local_1360 = *(undefined8 *)*local_1328;
          uStack_1358 = *(undefined8 *)(*local_1328 + 8);
          local_ba8 = local_1328;
          local_b00 = local_1540;
          uStack_af8 = uStack_1538;
          local_1f0 = ZEXT816(0) << 0x20;
          local_260 = 0;
          local_1e0._8_8_ = SUB168(ZEXT816(0),4);
          uStack_258 = local_1e0._8_8_;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_1e0._8_8_;
          local_b10 = vmaxps_avx(auVar5 << 0x40,*local_1328);
          local_160 = 0;
          uStack_158 = local_1e0._8_8_;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_1e0._8_8_;
          local_b20 = vminps_avx(auVar6 << 0x40,*local_1328);
          local_60._0_4_ = (float)local_1540;
          local_60._4_4_ = (float)((ulong)local_1540 >> 0x20);
          uStack_58._0_4_ = (float)uStack_1538;
          uStack_58._4_4_ = (float)((ulong)uStack_1538 >> 0x20);
          local_70._0_4_ = local_b20._0_4_;
          local_70._4_4_ = local_b20._4_4_;
          uStack_68._0_4_ = local_b20._8_4_;
          uStack_68._4_4_ = local_b20._12_4_;
          local_f0 = (float)local_60 * (float)local_70;
          fStack_ec = local_60._4_4_ * local_70._4_4_;
          fStack_e8 = (float)uStack_58 * (float)uStack_68;
          fStack_e4 = uStack_58._4_4_ * uStack_68._4_4_;
          local_e0._0_4_ = local_b10._0_4_;
          local_e0._4_4_ = local_b10._4_4_;
          uStack_d8._0_4_ = local_b10._8_4_;
          uStack_d8._4_4_ = local_b10._12_4_;
          local_bc0 = (float)local_e0 + local_f0;
          fStack_bbc = local_e0._4_4_ + fStack_ec;
          fStack_bb8 = (float)uStack_d8 + fStack_e8;
          fStack_bb4 = uStack_d8._4_4_ + fStack_e4;
          *(ulong *)*local_1328 = CONCAT44(fStack_bbc,local_bc0);
          *(ulong *)(*local_1328 + 8) = CONCAT44(fStack_bb4,fStack_bb8);
          local_1328 = local_1328 + 1;
          local_af0 = local_1360;
          uStack_ae8 = uStack_1358;
          local_270 = local_1360;
          uStack_268 = uStack_1358;
          local_1e0 = local_1f0;
          local_170 = local_1360;
          uStack_168 = uStack_1358;
          local_e0 = local_b10._0_8_;
          uStack_d8 = local_b10._8_8_;
          local_70 = local_b20._0_8_;
          uStack_68 = local_b20._8_8_;
          local_60 = local_1540;
          uStack_58 = uStack_1538;
        }
      }
    }
    if (local_1064 == 3) {
      local_1364 = local_1058->w;
      local_1368 = local_1058->h;
      local_136c = local_1058->c;
      local_1370 = local_1364 * local_1368;
      for (local_1374 = 0; local_1374 < local_136c; local_1374 = local_1374 + 1) {
        this_00 = &local_13c8;
        ncnn::Mat::channel(this_00,(int)((ulong)in_stack_ffffffffffffeaa8 >> 0x20));
        pauVar11 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(this_00);
        ncnn::Mat::~Mat((Mat *)0x4d3287);
        local_1380 = pauVar11;
        if (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) < 2)
        {
          pfVar9 = ncnn::Mat::operator[]
                             ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                     *(long *)(*(long *)in_RDI + -0x18)),0);
          local_a60 = *pfVar9;
          local_1560 = CONCAT44(local_a60,local_a60);
          in_stack_ffffffffffffeaa8 = CONCAT44(local_a60,local_a60);
          fStack_a5c = local_a60;
          fStack_a58 = local_a60;
          fStack_a54 = local_a60;
          local_a44 = local_a60;
        }
        else {
          local_c10 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                        *(long *)(*(long *)in_RDI + -0x18)));
          local_c10 = local_c10 + (local_1374 << 2);
          local_1560 = *(undefined8 *)local_c10;
          in_stack_ffffffffffffeaa8 = *(undefined8 *)(local_c10 + 2);
        }
        local_13e0 = local_1560;
        for (local_13e4 = 0; local_13e4 < local_1370; local_13e4 = local_13e4 + 1) {
          local_c18 = local_1380;
          local_1400 = *(undefined8 *)*local_1380;
          uStack_13f8 = *(undefined8 *)(*local_1380 + 8);
          local_bc8 = local_1380;
          local_b40 = local_1560;
          local_1d0 = ZEXT816(0) << 0x20;
          local_240 = 0;
          local_1c0._8_8_ = SUB168(ZEXT816(0),4);
          uStack_238 = local_1c0._8_8_;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_1c0._8_8_;
          local_b50 = vmaxps_avx(auVar7 << 0x40,*local_1380);
          local_140 = 0;
          uStack_138 = local_1c0._8_8_;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_1c0._8_8_;
          local_b60 = vminps_avx(auVar8 << 0x40,*local_1380);
          local_40._0_4_ = (float)local_1560;
          local_40._4_4_ = (float)((ulong)local_1560 >> 0x20);
          uStack_38._0_4_ = (float)in_stack_ffffffffffffeaa8;
          uStack_38._4_4_ = (float)((ulong)in_stack_ffffffffffffeaa8 >> 0x20);
          local_50._0_4_ = local_b60._0_4_;
          local_50._4_4_ = local_b60._4_4_;
          uStack_48._0_4_ = local_b60._8_4_;
          uStack_48._4_4_ = local_b60._12_4_;
          local_d0 = (float)local_40 * (float)local_50;
          fStack_cc = local_40._4_4_ * local_50._4_4_;
          fStack_c8 = (float)uStack_38 * (float)uStack_48;
          fStack_c4 = uStack_38._4_4_ * uStack_48._4_4_;
          local_c0._0_4_ = local_b50._0_4_;
          local_c0._4_4_ = local_b50._4_4_;
          uStack_b8._0_4_ = local_b50._8_4_;
          uStack_b8._4_4_ = local_b50._12_4_;
          local_be0 = (float)local_c0 + local_d0;
          fStack_bdc = local_c0._4_4_ + fStack_cc;
          fStack_bd8 = (float)uStack_b8 + fStack_c8;
          fStack_bd4 = uStack_b8._4_4_ + fStack_c4;
          *(ulong *)*local_1380 = CONCAT44(fStack_bdc,local_be0);
          *(ulong *)(*local_1380 + 8) = CONCAT44(fStack_bd4,fStack_bd8);
          local_1380 = local_1380 + 1;
          uStack_b38 = in_stack_ffffffffffffeaa8;
          local_b30 = local_1400;
          uStack_b28 = uStack_13f8;
          local_250 = local_1400;
          uStack_248 = uStack_13f8;
          local_1c0 = local_1d0;
          local_150 = local_1400;
          uStack_148 = uStack_13f8;
          local_c0 = local_b50._0_8_;
          uStack_b8 = local_b50._8_8_;
          local_50 = local_b60._0_8_;
          uStack_48 = local_b60._8_8_;
          local_40 = local_1560;
          uStack_38 = in_stack_ffffffffffffeaa8;
        }
        uStack_13d8 = in_stack_ffffffffffffeaa8;
      }
    }
    local_1044 = 0;
  }
  else if (local_1064 == 3) {
    local_1404 = in_RSI->w;
    local_1408 = in_RSI->h;
    local_140c = in_RSI->c;
    local_1410 = local_1404 * local_1408;
    local_1418 = ncnn::Mat::operator_cast_to_float_
                           ((Mat *)((long)&in_RDI[3].openmp_blocktime +
                                   *(long *)(*(long *)in_RDI + -0x18)));
    for (local_141c = 0; local_141c < local_140c; local_141c = local_141c + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffeab0,(int)((ulong)in_stack_ffffffffffffeaa8 >> 0x20));
      pauVar10 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_1470);
      ncnn::Mat::~Mat((Mat *)0x4d366f);
      if (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) < 2) {
        local_1574 = *local_1418;
      }
      else {
        local_1574 = local_1418[local_141c];
      }
      local_1478 = local_1410 >> 3;
      local_147c = local_1410 + local_1478 * -8;
      local_1428 = pauVar10;
      for (; 0 < local_1478; local_1478 = local_1478 + -1) {
        local_1040 = local_1428;
        local_e60 = *(undefined8 *)*local_1428;
        uStack_e58 = *(undefined8 *)(*local_1428 + 8);
        uStack_e50 = *(undefined8 *)(*local_1428 + 0x10);
        uStack_e48 = *(undefined8 *)(*local_1428 + 0x18);
        local_fc8 = local_1428;
        local_c28 = local_1574;
        local_2d0 = local_1574;
        auVar1 = vinsertps_avx(ZEXT416((uint)local_1574),ZEXT416((uint)local_1574),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_1574),0x20);
        local_300 = vinsertps_avx(auVar1,ZEXT416((uint)local_1574),0x30);
        auVar1 = vinsertps_avx(ZEXT416((uint)local_1574),ZEXT416((uint)local_1574),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_1574),0x20);
        auStack_2f0 = vinsertps_avx(auVar1,ZEXT416((uint)local_1574),0x30);
        local_e80 = local_300._0_8_;
        uStack_e78 = local_300._8_8_;
        uStack_e70 = auStack_2f0._0_8_;
        uStack_e68 = auStack_2f0._8_8_;
        local_7c0 = ZEXT832(0) << 0x20;
        local_8e0 = 0;
        local_7a0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_8d8 = local_7a0._8_8_;
        uStack_8d0 = 0;
        uStack_8c8 = 0;
        local_ea0 = vmaxps_avx(ZEXT832((ulong)local_7a0._8_8_) << 0x40,*local_1428);
        local_660 = 0;
        uStack_658 = local_7a0._8_8_;
        uStack_650 = 0;
        uStack_648 = 0;
        local_ec0 = vminps_avx(ZEXT832((ulong)local_7a0._8_8_) << 0x40,*local_1428);
        local_3e0._0_4_ = local_300._0_4_;
        local_3e0._4_4_ = local_300._4_4_;
        uStack_3d8._0_4_ = local_300._8_4_;
        uStack_3d8._4_4_ = local_300._12_4_;
        uStack_3d0._0_4_ = auStack_2f0._0_4_;
        uStack_3d0._4_4_ = auStack_2f0._4_4_;
        uStack_3c8._0_4_ = auStack_2f0._8_4_;
        uStack_3c8._4_4_ = auStack_2f0._12_4_;
        fStack_524 = uStack_3c8._4_4_;
        local_400._0_4_ = local_ec0._0_4_;
        local_400._4_4_ = local_ec0._4_4_;
        uStack_3f8._0_4_ = local_ec0._8_4_;
        uStack_3f8._4_4_ = local_ec0._12_4_;
        uStack_3f0._0_4_ = local_ec0._16_4_;
        uStack_3f0._4_4_ = local_ec0._20_4_;
        uStack_3e8._0_4_ = local_ec0._24_4_;
        local_540 = (float)local_3e0 * (float)local_400;
        fStack_53c = local_3e0._4_4_ * local_400._4_4_;
        fStack_538 = (float)uStack_3d8 * (float)uStack_3f8;
        fStack_534 = uStack_3d8._4_4_ * uStack_3f8._4_4_;
        fStack_530 = (float)uStack_3d0 * (float)uStack_3f0;
        fStack_52c = uStack_3d0._4_4_ * uStack_3f0._4_4_;
        fStack_528 = (float)uStack_3c8 * (float)uStack_3e8;
        local_520._0_4_ = local_ea0._0_4_;
        local_520._4_4_ = local_ea0._4_4_;
        uStack_518._0_4_ = local_ea0._8_4_;
        uStack_518._4_4_ = local_ea0._12_4_;
        uStack_510._0_4_ = local_ea0._16_4_;
        uStack_510._4_4_ = local_ea0._20_4_;
        uStack_508._0_4_ = local_ea0._24_4_;
        uStack_508._4_4_ = local_ea0._28_4_;
        local_1000 = (float)local_520 + local_540;
        fStack_ffc = local_520._4_4_ + fStack_53c;
        fStack_ff8 = (float)uStack_518 + fStack_538;
        fStack_ff4 = uStack_518._4_4_ + fStack_534;
        fStack_ff0 = (float)uStack_510 + fStack_530;
        fStack_fec = uStack_510._4_4_ + fStack_52c;
        fStack_fe8 = (float)uStack_508 + fStack_528;
        fStack_fe4 = uStack_508._4_4_ + uStack_3c8._4_4_;
        *(ulong *)*local_1428 = CONCAT44(fStack_ffc,local_1000);
        *(ulong *)(*local_1428 + 8) = CONCAT44(fStack_ff4,fStack_ff8);
        *(ulong *)(*local_1428 + 0x10) = CONCAT44(fStack_fec,fStack_ff0);
        *(ulong *)(*local_1428 + 0x18) = CONCAT44(fStack_fe4,fStack_fe8);
        local_1428 = local_1428 + 1;
        local_900 = local_e60;
        uStack_8f8 = uStack_e58;
        uStack_8f0 = uStack_e50;
        uStack_8e8 = uStack_e48;
        local_7a0 = local_7c0;
        local_680 = local_e60;
        uStack_678 = uStack_e58;
        uStack_670 = uStack_e50;
        uStack_668 = uStack_e48;
        local_520 = local_ea0._0_8_;
        uStack_518 = local_ea0._8_8_;
        uStack_510 = local_ea0._16_8_;
        uStack_508 = local_ea0._24_8_;
        local_400 = local_ec0._0_8_;
        uStack_3f8 = local_ec0._8_8_;
        uStack_3f0 = local_ec0._16_8_;
        uStack_3e8 = local_ec0._24_8_;
        local_3e0 = local_300._0_8_;
        uStack_3d8 = local_300._8_8_;
        uStack_3d0 = auStack_2f0._0_8_;
        uStack_3c8 = auStack_2f0._8_8_;
        local_2cc = local_2d0;
        local_2c8 = local_2d0;
        local_2c4 = local_2d0;
        local_2c0 = local_2d0;
        local_2bc = local_2d0;
        local_2b8 = local_2d0;
        local_2b4 = local_2d0;
      }
      for (; 0 < local_147c; local_147c = local_147c + -1) {
        if (*(float *)*local_1428 < 0.0) {
          *(float *)*local_1428 = local_1574 * *(float *)*local_1428;
        }
        local_1428 = (undefined1 (*) [32])(*local_1428 + 4);
      }
    }
    local_1044 = 0;
  }
  else {
    local_1044 = PReLU::forward_inplace(in_stack_ffffffffffffeb68,in_stack_ffffffffffffeb60,in_RDI);
  }
  return local_1044;
}

Assistant:

int PReLU_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}